

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop.c
# Opt level: O1

Qiniu_Error
Qiniu_FOP_Prefop(Qiniu_Client *self,Qiniu_FOP_PrefopRet *ret,Qiniu_FOP_PrefopItemRet *itemsRet,
                Qiniu_ItemCount *itemsCount,char *persistentId,Qiniu_ItemCount maxItemsCount)

{
  Qiniu_FOP_PrefopRet *pQVar1;
  uint uVar2;
  int iVar3;
  char *addr;
  char *pcVar4;
  Qiniu_Json *array;
  cJSON *self_00;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  Qiniu_Reader QVar8;
  Qiniu_Error QVar9;
  cJSON *root;
  char *local_70;
  uint local_68;
  Qiniu_Bool escapePersistentIdOk;
  int *local_60;
  Qiniu_FOP_PrefopRet *local_58;
  char *apiHost;
  Qiniu_ReadBuf emptyBodyBuf;
  
  emptyBodyBuf.buf = (char *)0x0;
  emptyBodyBuf.off = 0;
  emptyBodyBuf.limit = 0;
  local_68 = maxItemsCount;
  local_60 = itemsCount;
  local_58 = ret;
  QVar8 = Qiniu_BufReader(&emptyBodyBuf,(char *)0x0,0);
  local_70 = (char *)QVar8.self;
  addr = Qiniu_QueryEscape(persistentId,&escapePersistentIdOk);
  QVar9 = _Qiniu_Region_Get_Api_Host(self,(char *)0x0,(char *)0x0,&apiHost);
  uVar2 = QVar9.code;
  pcVar4 = QVar9.message;
  if (uVar2 == 200) {
    pcVar4 = Qiniu_String_Concat(apiHost,"/status/get/prefop?id=",addr,0);
    if (escapePersistentIdOk != 0) {
      Qiniu_Free(addr);
    }
    QVar8.Read = QVar8.Read;
    QVar8.self = local_70;
    QVar9 = Qiniu_Client_CallWithMethod
                      (self,&root,pcVar4,QVar8,0,"application/x-www-form-urlencoded","GET",
                       (char *)0x0);
    local_70 = QVar9.message;
    uVar2 = QVar9.code;
    Qiniu_Free(pcVar4);
    pcVar4 = local_70;
    if (uVar2 == 200) {
      pcVar4 = Qiniu_Json_GetString(root,"id",(char *)0x0);
      pQVar1 = local_58;
      local_58->id = pcVar4;
      iVar3 = Qiniu_Json_GetInt(root,"code",0);
      pQVar1->code = iVar3;
      pcVar4 = Qiniu_Json_GetString(root,"desc",(char *)0x0);
      pQVar1->desc = pcVar4;
      pcVar4 = Qiniu_Json_GetString(root,"inputBucket",(char *)0x0);
      pQVar1->inputBucket = pcVar4;
      pcVar4 = Qiniu_Json_GetString(root,"inputBucket",(char *)0x0);
      pQVar1->inputKey = pcVar4;
      pcVar4 = Qiniu_Json_GetString(root,"taskFrom",(char *)0x0);
      pQVar1->taskFrom = pcVar4;
      iVar3 = Qiniu_Json_GetInt(root,"type",0);
      pQVar1->type = iVar3;
      pcVar4 = Qiniu_Json_GetString(root,"creationDate",(char *)0x0);
      if (pcVar4 != (char *)0x0) {
        _Qiniu_Parse_Date_Time(pcVar4,&pQVar1->creationDate);
      }
      iVar3 = Qiniu_Json_GetArraySize(root,"items",0);
      piVar6 = local_60;
      *local_60 = iVar3;
      array = Qiniu_Json_GetObjectItem(root,"items",(Qiniu_Json *)0x0);
      uVar2 = 200;
      pcVar4 = local_70;
      if ((0 < (int)local_68) && (0 < *piVar6)) {
        uVar7 = (ulong)local_68;
        piVar6 = &itemsRet->returnOld;
        uVar5 = 0;
        do {
          self_00 = cJSON_GetArrayItem(array,(int)uVar5);
          pcVar4 = Qiniu_Json_GetString(self_00,"cmd",(char *)0x0);
          ((Qiniu_FOP_PrefopItemRet *)(piVar6 + -0xb))->cmd = pcVar4;
          iVar3 = Qiniu_Json_GetInt(self_00,"code",0);
          piVar6[-1] = iVar3;
          pcVar4 = Qiniu_Json_GetString(self_00,"desc",(char *)0x0);
          *(char **)(piVar6 + -9) = pcVar4;
          pcVar4 = Qiniu_Json_GetString(self_00,"error",(char *)0x0);
          *(char **)(piVar6 + -7) = pcVar4;
          pcVar4 = Qiniu_Json_GetString(self_00,"hash",(char *)0x0);
          *(char **)(piVar6 + -5) = pcVar4;
          pcVar4 = Qiniu_Json_GetString(self_00,"key",(char *)0x0);
          *(char **)(piVar6 + -3) = pcVar4;
          iVar3 = Qiniu_Json_GetInt(self_00,"returnOld",0);
          *piVar6 = iVar3;
          uVar5 = uVar5 + 1;
          pcVar4 = local_70;
          if (uVar7 <= uVar5) break;
          piVar6 = piVar6 + 0xc;
        } while ((long)uVar5 < (long)*local_60);
      }
    }
  }
  QVar9._4_4_ = 0;
  QVar9.code = uVar2;
  QVar9.message = pcVar4;
  return QVar9;
}

Assistant:

Qiniu_Error Qiniu_FOP_Prefop(Qiniu_Client *self, Qiniu_FOP_PrefopRet *ret, Qiniu_FOP_PrefopItemRet *itemsRet, Qiniu_ItemCount *itemsCount, const char *persistentId, Qiniu_ItemCount maxItemsCount)
{
    Qiniu_Error err;
    cJSON *root, *items, *item;
    Qiniu_ItemCount curIndex;
    char *encodedPersistentId = NULL, *url = NULL, *creationDateStr = NULL;
    Qiniu_ReadBuf emptyBodyBuf = {NULL, 0, 0};
    Qiniu_Reader emptyBody = Qiniu_BufReader(&emptyBodyBuf, 0, 0);
    Qiniu_Bool escapePersistentIdOk;

    encodedPersistentId = Qiniu_QueryEscape(persistentId, &escapePersistentIdOk);

    const char *apiHost;
    err = _Qiniu_Region_Get_Api_Host(self, NULL, NULL, &apiHost);
    if (err.code != 200)
    {
        return err;
    }
    url = Qiniu_String_Concat(apiHost, "/status/get/prefop?id=", encodedPersistentId, NULL);
    if (escapePersistentIdOk)
    {
        Qiniu_Free(encodedPersistentId);
    }

    err = Qiniu_Client_CallWithMethod(
        self,
        &root,
        url,
        emptyBody,
        0,
        "application/x-www-form-urlencoded",
        "GET",
        NULL);
    Qiniu_Free(url);
    if (err.code != 200)
    {
        return err;
    }

    ret->id = Qiniu_Json_GetString(root, "id", NULL);
    ret->code = Qiniu_Json_GetInt(root, "code", 0);
    ret->desc = Qiniu_Json_GetString(root, "desc", NULL);
    ret->inputBucket = Qiniu_Json_GetString(root, "inputBucket", NULL);
    ret->inputKey = Qiniu_Json_GetString(root, "inputBucket", NULL);
    ret->taskFrom = Qiniu_Json_GetString(root, "taskFrom", NULL);
    ret->type = Qiniu_Json_GetInt(root, "type", 0);
    creationDateStr = (char *)Qiniu_Json_GetString(root, "creationDate", NULL);
    if (creationDateStr != NULL)
    {
        _Qiniu_Parse_Date_Time(creationDateStr, &ret->creationDate);
    }

    *itemsCount = Qiniu_Json_GetArraySize(root, "items", 0);
    items = Qiniu_Json_GetObjectItem(root, "items", 0);
    for (curIndex = 0; curIndex < *itemsCount && curIndex < maxItemsCount; curIndex++)
    {
        item = cJSON_GetArrayItem(items, curIndex);
        itemsRet[curIndex].cmd = Qiniu_Json_GetString(item, "cmd", NULL);
        itemsRet[curIndex].code = Qiniu_Json_GetInt(item, "code", 0);
        itemsRet[curIndex].desc = Qiniu_Json_GetString(item, "desc", NULL);
        itemsRet[curIndex].error = Qiniu_Json_GetString(item, "error", NULL);
        itemsRet[curIndex].hash = Qiniu_Json_GetString(item, "hash", NULL);
        itemsRet[curIndex].key = Qiniu_Json_GetString(item, "key", NULL);
        itemsRet[curIndex].returnOld = Qiniu_Json_GetInt(item, "returnOld", 0);
    }
    return err;
}